

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::Clear(ImDrawList *this)

{
  ImDrawList *this_local;
  
  ImVector<ImDrawCmd>::resize(&this->CmdBuffer,0);
  ImVector<unsigned_short>::resize(&this->IdxBuffer,0);
  ImVector<ImDrawVert>::resize(&this->VtxBuffer,0);
  this->Flags = 3;
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (ImDrawIdx *)0x0;
  ImVector<ImVec4>::resize(&this->_ClipRectStack,0);
  ImVector<void_*>::resize(&this->_TextureIdStack,0);
  ImVector<ImVec2>::resize(&this->_Path,0);
  this->_ChannelsCurrent = 0;
  this->_ChannelsCount = 1;
  return;
}

Assistant:

void ImDrawList::Clear()
{
    CmdBuffer.resize(0);
    IdxBuffer.resize(0);
    VtxBuffer.resize(0);
    Flags = ImDrawListFlags_AntiAliasedLines | ImDrawListFlags_AntiAliasedFill;
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.resize(0);
    _TextureIdStack.resize(0);
    _Path.resize(0);
    _ChannelsCurrent = 0;
    _ChannelsCount = 1;
    // NB: Do not clear channels so our allocations are re-used after the first frame.
}